

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_window_show(nk_context *ctx,char *name,nk_show_states s)

{
  int len;
  nk_hash hash;
  nk_window *pnVar1;
  
  if (ctx != (nk_context *)0x0) {
    len = nk_strlen(name);
    hash = nk_murmur_hash(name,len,0x40);
    pnVar1 = nk_find_window(ctx,hash,name);
    if (pnVar1 != (nk_window *)0x0) {
      pnVar1->flags = (uint)(s == NK_HIDDEN) << 0xd | pnVar1->flags & 0xffffdfff;
    }
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x4a7a,
                "void nk_window_show(struct nk_context *, const char *, enum nk_show_states)");
}

Assistant:

NK_API void
nk_window_show(struct nk_context *ctx, const char *name, enum nk_show_states s)
{
    int title_len;
    nk_hash title_hash;
    struct nk_window *win;
    NK_ASSERT(ctx);
    if (!ctx) return;

    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) return;
    if (s == NK_HIDDEN) {
        win->flags |= NK_WINDOW_HIDDEN;
    } else win->flags &= ~(nk_flags)NK_WINDOW_HIDDEN;
}